

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateJSBooleanTest
          (Lowerer *this,RegOpnd *regSrc,Instr *insertInstr,LabelInstr *labelTarget,
          bool fContinueLabel)

{
  bool bVar1;
  IndirOpnd *src1;
  Opnd *src2;
  Opnd *jsBooleanVTable;
  IndirOpnd *vtablePtrOpnd;
  LabelInstr *pLStack_30;
  bool fContinueLabel_local;
  LabelInstr *labelTarget_local;
  Instr *insertInstr_local;
  RegOpnd *regSrc_local;
  Lowerer *this_local;
  
  vtablePtrOpnd._7_1_ = fContinueLabel;
  pLStack_30 = labelTarget;
  labelTarget_local = (LabelInstr *)insertInstr;
  insertInstr_local = (Instr *)regSrc;
  regSrc_local = (RegOpnd *)this;
  vtablePtrOpnd._4_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&regSrc->super_Opnd);
  bVar1 = ValueType::IsBoolean((ValueType *)((long)&vtablePtrOpnd + 4));
  if (bVar1) {
    if (((vtablePtrOpnd._7_1_ & 1) != 0) &&
       (InsertBranch(Br,pLStack_30,&labelTarget_local->super_Instr),
       ((byte)pLStack_30->field_0x78 >> 1 & 1) != 0)) {
      pLStack_30->field_0x78 = pLStack_30->field_0x78 & 0xdf | 0x20;
    }
    this_local._7_1_ = false;
  }
  else {
    src1 = IR::IndirOpnd::New((RegOpnd *)insertInstr_local,0,TyUint64,this->m_func,false);
    src2 = LoadVTableValueOpnd(this,&labelTarget_local->super_Instr,VtableJavascriptBoolean);
    InsertCompare(&src1->super_Opnd,src2,&labelTarget_local->super_Instr);
    if ((vtablePtrOpnd._7_1_ & 1) == 0) {
      InsertBranch(BrNeq_A,pLStack_30,&labelTarget_local->super_Instr);
    }
    else {
      InsertBranch(BrEq_A,pLStack_30,&labelTarget_local->super_Instr);
      InsertLabel(true,&labelTarget_local->super_Instr);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Lowerer::GenerateJSBooleanTest(IR::RegOpnd * regSrc, IR::Instr * insertInstr, IR::LabelInstr * labelTarget, bool fContinueLabel)
{
    if (regSrc->GetValueType().IsBoolean())
    {
        if (fContinueLabel)
        {
            // JMP $labelTarget
            InsertBranch(Js::OpCode::Br, labelTarget, insertInstr);
#if DBG
            if (labelTarget->isOpHelper)
            {
                labelTarget->m_noHelperAssert = true;
            }
#endif
        }
        return false;
    }

    IR::IndirOpnd * vtablePtrOpnd = IR::IndirOpnd::New(regSrc, 0, TyMachPtr, this->m_func);
    IR::Opnd * jsBooleanVTable = LoadVTableValueOpnd(insertInstr, VTableValue::VtableJavascriptBoolean);
    InsertCompare(vtablePtrOpnd, jsBooleanVTable, insertInstr);

    if (fContinueLabel)
    {
        // JEQ $labelTarget
        InsertBranch(Js::OpCode::BrEq_A, labelTarget, insertInstr);

        // $helper
        InsertLabel(true, insertInstr);
    }
    else
    {
        // JNE $labelTarget
        InsertBranch(Js::OpCode::BrNeq_A, labelTarget, insertInstr);
    }
    return true;
}